

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode output_auth_headers(Curl_easy *data,connectdata *conn,auth *authstatus,char *request,
                            char *path,_Bool proxy)

{
  char *pcVar1;
  char *local_80;
  char *local_78;
  char *local_70;
  CURLcode local_4c;
  char *pcStack_48;
  CURLcode result;
  char *auth;
  _Bool proxy_local;
  char *path_local;
  char *request_local;
  auth *authstatus_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pcStack_48 = (char *)0x0;
  local_4c = CURLE_OK;
  if (authstatus->picked == 0x80) {
    pcStack_48 = "AWS_SIGV4";
    local_4c = Curl_output_aws_sigv4(data,proxy);
  }
  else if (authstatus->picked == 8) {
    pcStack_48 = "NTLM";
    local_4c = Curl_output_ntlm(data,proxy);
  }
  else {
    if (authstatus->picked != 2) {
      if (authstatus->picked == 1) {
        if ((((proxy) && (((ulong)conn->bits >> 2 & 1) != 0)) &&
            (pcVar1 = Curl_checkProxyheaders(data,conn,"Proxy-authorization",0x13),
            pcVar1 == (char *)0x0)) ||
           (((!proxy && ((data->state).aptr.user != (char *)0x0)) &&
            (pcVar1 = Curl_checkheaders(data,"Authorization",0xd), pcVar1 == (char *)0x0)))) {
          pcStack_48 = "Basic";
          local_4c = http_output_basic(data,proxy);
          if (local_4c != CURLE_OK) {
            return local_4c;
          }
        }
        authstatus->field_0x18 = authstatus->field_0x18 & 0xfe | 1;
      }
      goto LAB_0014c184;
    }
    pcStack_48 = "Digest";
    local_4c = Curl_output_digest(data,proxy,(uchar *)request,(uchar *)path);
  }
  if (local_4c != CURLE_OK) {
    return local_4c;
  }
LAB_0014c184:
  if (authstatus->picked == 0x40) {
    if (((!proxy) && ((data->set).str[0x3c] != (char *)0x0)) &&
       (pcVar1 = Curl_checkheaders(data,"Authorization",0xd), pcVar1 == (char *)0x0)) {
      pcStack_48 = "Bearer";
      local_4c = http_output_bearer(data);
      if (local_4c != CURLE_OK) {
        return local_4c;
      }
    }
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfe | 1;
  }
  if (pcStack_48 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
       (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
      pcVar1 = "Server";
      if (proxy) {
        pcVar1 = "Proxy";
        if ((data->state).aptr.proxyuser == (char *)0x0) {
          local_70 = "";
        }
        else {
          local_70 = (data->state).aptr.proxyuser;
        }
        local_78 = local_70;
      }
      else {
        if ((data->state).aptr.user == (char *)0x0) {
          local_80 = "";
        }
        else {
          local_80 = (data->state).aptr.user;
        }
        local_78 = local_80;
      }
      Curl_infof(data,"%s auth using %s with user \'%s\'",pcVar1,pcStack_48,local_78);
    }
    authstatus->field_0x18 =
         authstatus->field_0x18 & 0xfd | ((authstatus->field_0x18 & 1) == 0) << 1;
  }
  return local_4c;
}

Assistant:

static CURLcode
output_auth_headers(struct Curl_easy *data,
                    struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
  (void)conn;

#ifdef CURL_DISABLE_DIGEST_AUTH
  (void)request;
  (void)path;
#endif
#ifndef CURL_DISABLE_AWS
  if(authstatus->picked == CURLAUTH_AWS_SIGV4) {
    auth = "AWS_SIGV4";
    result = Curl_output_aws_sigv4(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_SPNEGO
  if(authstatus->picked == CURLAUTH_NEGOTIATE) {
    auth = "Negotiate";
    result = Curl_output_negotiate(data, conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(data, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(data,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if(
#ifndef CURL_DISABLE_PROXY
      (proxy && conn->bits.proxy_user_passwd &&
       !Curl_checkProxyheaders(data, conn, STRCONST("Proxy-authorization"))) ||
#endif
      (!proxy && data->state.aptr.user &&
       !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Basic";
      result = http_output_basic(data, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && data->set.str[STRING_BEARER] &&
        !Curl_checkheaders(data, STRCONST("Authorization")))) {
      auth = "Bearer";
      result = http_output_bearer(data);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
#endif

  if(auth) {
#ifndef CURL_DISABLE_PROXY
    infof(data, "%s auth using %s with user '%s'",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (data->state.aptr.proxyuser ?
                   data->state.aptr.proxyuser : "") :
          (data->state.aptr.user ?
           data->state.aptr.user : ""));
#else
    (void)proxy;
    infof(data, "Server auth using %s with user '%s'",
          auth, data->state.aptr.user ?
          data->state.aptr.user : "");
#endif
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return result;
}